

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector32::retainAll(UVector32 *this,UVector32 *other)

{
  int32_t iVar1;
  int local_20;
  int32_t i;
  int32_t j;
  UBool changed;
  UVector32 *other_local;
  UVector32 *this_local;
  
  i._3_1_ = '\0';
  local_20 = size(this);
  while (local_20 = local_20 + -1, -1 < local_20) {
    iVar1 = indexOf(other,this->elements[local_20],0);
    if (iVar1 < 0) {
      removeElementAt(this,local_20);
      i._3_1_ = '\x01';
    }
  }
  return i._3_1_;
}

Assistant:

UBool UVector32::retainAll(const UVector32& other) {
    UBool changed = FALSE;
    for (int32_t j=size()-1; j>=0; --j) {
        int32_t i = other.indexOf(elements[j]);
        if (i < 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}